

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarmath_p.h
# Opt level: O3

int QGregorianCalendar::weekDayOfJulian(qint64 jd)

{
  int iVar1;
  
  if (jd < 0) {
    iVar1 = ((int)((ulong)~jd / 7) * 7 - (int)~jd) + 6;
  }
  else {
    iVar1 = (int)((ulong)jd / 7) * -7 + (int)jd;
  }
  return iVar1 + 1;
}

Assistant:

constexpr auto qDivMod(Int a)
{
    struct R { Int quotient; Int remainder; };
    if constexpr (std::is_signed_v<Int>) {
        if (a < 0) {
            ++a;    // can't overflow, it's negative
            return R { Int(a / int(b) - 1), Int(a % int(b) - 1 + int(b)) };
        }
    }
    return R { Int(a / int(b)), Int(a % int(b)) };
}